

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

void __thiscall wasm::TranslateToFuzzReader::addImportThrowingSupport(TranslateToFuzzReader *this)

{
  Module *module;
  pointer pFVar1;
  Expression *pEVar2;
  Type local_90;
  Type local_88;
  Signature local_80;
  HeapType local_70;
  Name local_68;
  Name local_58 [2];
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_38;
  __single_object func;
  string_view local_20;
  TranslateToFuzzReader *local_10;
  TranslateToFuzzReader *this_local;
  
  module = this->wasm;
  local_10 = this;
  Name::Name((Name *)&func,"throw");
  local_20 = (string_view)Names::getValidFunctionName(module,(Name)_func);
  Name::operator=(&this->throwImportName,(Name *)&local_20);
  std::make_unique<wasm::Function>();
  pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_38);
  Name::operator=((Name *)pFVar1,&this->throwImportName);
  if ((this->preserveImportsAndExports & 1U) == 0) {
    Name::Name(local_58,"fuzzing-support");
    pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_38);
    Name::operator=(&(pFVar1->super_Importable).module,local_58);
    Name::Name(&local_68,"throw");
    pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_38);
    Name::operator=(&(pFVar1->super_Importable).base,&local_68);
  }
  else {
    pEVar2 = (Expression *)Builder::makeNop(&this->builder);
    pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_38);
    pFVar1->body = pEVar2;
  }
  Type::Type(&local_88,i32);
  Type::Type(&local_90,none);
  Signature::Signature(&local_80,local_88,local_90);
  ::wasm::HeapType::HeapType(&local_70,local_80);
  pFVar1 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_38);
  (pFVar1->type).id = local_70.id;
  ::wasm::Module::addFunction((unique_ptr *)this->wasm);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_38);
  return;
}

Assistant:

void TranslateToFuzzReader::addImportThrowingSupport() {
  // Throw some kind of exception from JS. If we send 0 then a pure JS
  // exception is thrown, and any other value is the value in a wasm tag.
  throwImportName = Names::getValidFunctionName(wasm, "throw");
  auto func = std::make_unique<Function>();
  func->name = throwImportName;
  if (!preserveImportsAndExports) {
    func->module = "fuzzing-support";
    func->base = "throw";
  } else {
    // As with logging, implement in a trivial way when we cannot add imports.
    func->body = builder.makeNop();
  }
  func->type = Signature(Type::i32, Type::none);
  wasm.addFunction(std::move(func));
}